

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

void __thiscall Arbitraryunsignedint::~Arbitraryunsignedint(Arbitraryunsignedint *this)

{
  testinator::Test::~Test(&this->super_Test);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(unsignedint, Arbitrary)
{
  testinator::Arbitrary<unsigned int> a;
  unsigned int v = a.generate(0,0);
  a.shrink(v);
  return true;
}